

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O0

_Bool COSE_Sign_Sign(HCOSE_SIGN h,cose_errback *perr)

{
  _Bool _Var1;
  cn_cbor *pcborBody_00;
  cn_cbor *pcborProtected_00;
  cn_cbor *pcborProtected;
  cn_cbor *pcborBody;
  COSE_SignerInfo *pSigner;
  COSE_SignMessage *pMessage;
  cose_errback *perr_local;
  HCOSE_SIGN h_local;
  
  _Var1 = IsValidSignHandle(h);
  if (_Var1) {
    pcborBody_00 = _COSE_arrayget_int((COSE *)h,2);
    if ((pcborBody_00 == (cn_cbor *)0x0) || (pcborBody_00->type != CN_CBOR_BYTES)) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      pcborProtected_00 = _COSE_encode_protected((COSE *)h,perr);
      if (pcborProtected_00 != (cn_cbor *)0x0) {
        pcborBody = *(cn_cbor **)(h + 0x58);
        while( true ) {
          if (pcborBody == (cn_cbor *)0x0) {
            return true;
          }
          _Var1 = _COSE_Signer_sign((COSE_SignerInfo *)pcborBody,pcborBody_00,pcborProtected_00,perr
                                   );
          if (!_Var1) break;
          pcborBody = pcborBody[1].next;
        }
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Sign_Sign(HCOSE_SIGN h, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
  // cn_cbor_context * context = NULL;
#endif
	COSE_SignMessage * pMessage = (COSE_SignMessage *)h;
	COSE_SignerInfo * pSigner;
	const cn_cbor * pcborBody;
	const cn_cbor * pcborProtected;

	if (!IsValidSignHandle(h)) {
		CHECK_CONDITION(false, COSE_ERR_INVALID_HANDLE);
	errorReturn:
		return false;
	}
#ifdef USE_CBOR_CONTEXT
	//	context = &pMessage->m_message.m_allocContext;
#endif

	pcborBody = _COSE_arrayget_int(&pMessage->m_message, INDEX_BODY);
	CHECK_CONDITION((pcborBody != NULL) && (pcborBody->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);

	pcborProtected = _COSE_encode_protected(&pMessage->m_message, perr);
	if (pcborProtected == NULL) goto errorReturn;

	for (pSigner = pMessage->m_signerFirst; pSigner != NULL; pSigner = pSigner->m_signerNext) {
		if (!_COSE_Signer_sign(pSigner, pcborBody, pcborProtected, perr)) goto errorReturn;
	}

	return true;
}